

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithCnNeedingRenamedUnits_Test
::
~Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithCnNeedingRenamedUnits_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithCnNeedingRenamedUnits_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponentWithCnNeedingRenamedUnits)
{
    const std::string math =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <apply>\n"
        "    <eq/>\n"
        "    <ci>P</ci>\n"
        "    <cn cellml:units=\"per_fmol\">3.0</cn>\n"
        "  </apply>\n"
        "  <apply>\n"
        "    <eq/>\n"
        "    <ci>R</ci>\n"
        "    <cn cellml:units=\"fmol\">4.2</cn>\n"
        "  </apply>\n"
        "</math>";

    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, "importer/units/base_model.cellml");

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::ComponentPtr ic = libcellml::Component::create("my_component");
    ic->setImportSource(import);
    ic->setImportReference("my_component");

    importModel->component(0)->setMath(math);

    libcellml::UnitsPtr u = libcellml::Units::create("fmol");
    u->addUnit("farad");
    u->addUnit("mole");

    model->addComponent(ic);
    model->addUnits(u);

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(3), flatModel->unitsCount());
    EXPECT_EQ("fmol", flatModel->units(0)->name());
    EXPECT_EQ("fmol_1", flatModel->units(1)->name());
    EXPECT_EQ("per_fmol", flatModel->units(2)->name());
    EXPECT_EQ("fmol_1", flatModel->units(2)->unitAttributeReference(0));
    EXPECT_EQ("per_fmol", flatModel->component(0)->variable(0)->units()->name());
    EXPECT_TRUE(flatModel->component(0)->math().find("fmol_1") != std::string::npos);
}